

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

void __thiscall slang::ast::PulseStyleSymbol::resolve(PulseStyleSymbol *this)

{
  LookupLocation lookupLocation;
  SyntaxNode *this_00;
  Scope *this_01;
  Symbol *this_02;
  bitmask<slang::ast::ASTFlags> bVar1;
  Symbol *in_RDI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  PulseStyleDeclarationSyntax *syntax;
  ASTContext *in_stack_00000038;
  Scope *in_stack_00000040;
  SpecifyTerminalDir in_stack_0000004c;
  ASTContext context;
  Scope *parentParent;
  Scope *parent;
  SyntaxNode *syntaxPtr;
  undefined1 in_stack_ffffffffffffff68 [16];
  Scope *in_stack_ffffffffffffff78;
  
  in_RDI[1].field_0x4 = 1;
  this_00 = Symbol::getSyntax(in_RDI);
  this_01 = Symbol::getParentScope(in_RDI);
  this_02 = Scope::asSymbol(this_01);
  Symbol::getParentScope(this_02);
  LookupLocation::after(in_RDI);
  bVar1 = ast::operator|(in_stack_ffffffffffffff68._0_8_,(ASTFlags)in_RDI);
  lookupLocation._8_8_ = bVar1.m_bits;
  lookupLocation.scope = in_stack_ffffffffffffff78;
  ASTContext::ASTContext
            (in_stack_ffffffffffffff68._0_8_,(Scope *)in_RDI,lookupLocation,
             (bitmask<slang::ast::ASTFlags>)in_stack_ffffffffffffff68._8_8_);
  slang::syntax::SyntaxNode::as<slang::syntax::PulseStyleDeclarationSyntax>(this_00);
  sVar2 = bindTerminals((SeparatedSyntaxList<slang::syntax::NameSyntax> *)context.scope.ptr,
                        in_stack_0000004c,in_stack_00000040,in_stack_00000038);
  in_RDI[1].name._M_len = (size_t)sVar2._M_ptr;
  in_RDI[1].name._M_str = (char *)sVar2._M_extent._M_extent_value._M_extent_value;
  return;
}

Assistant:

void PulseStyleSymbol::resolve() const {
    isResolved = true;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<PulseStyleDeclarationSyntax>();
    terminals = bindTerminals(syntax.inputs, SpecifyBlockSymbol::SpecifyTerminalDir::Output,
                              parentParent, context);
}